

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O0

boolean confused_book(obj *spellbook)

{
  int iVar1;
  char *pcVar2;
  boolean local_11;
  boolean gone;
  obj *spellbook_local;
  
  local_11 = '\0';
  iVar1 = rn2(3);
  if ((iVar1 == 0) && (spellbook->otyp != 0x1bd)) {
    *(uint *)&spellbook->field_0x4a = *(uint *)&spellbook->field_0x4a & 0xff7fffff | 0x800000;
    pline("Being confused you have difficulties in controlling your actions.");
    (*windowprocs.win_pause)(P_MESSAGE);
    pline("You accidentally tear the spellbook to pieces.");
    if (((objects[spellbook->otyp].field_0x10 & 1) == 0) &&
       (objects[spellbook->otyp].oc_uname == (char *)0x0)) {
      docall(spellbook);
    }
    useup(spellbook);
    local_11 = '\x01';
  }
  else {
    pcVar2 = "first";
    if (spellbook == book) {
      pcVar2 = "next";
    }
    pline("You find yourself reading the %s line over and over again.",pcVar2);
  }
  return local_11;
}

Assistant:

static boolean confused_book(struct obj *spellbook)
{
	boolean gone = FALSE;

	if (!rn2(3) && spellbook->otyp != SPE_BOOK_OF_THE_DEAD) {
	    spellbook->in_use = TRUE;	/* in case called from learn */
	    pline(
	"Being confused you have difficulties in controlling your actions.");
	    win_pause_output(P_MESSAGE);
	    pline("You accidentally tear the spellbook to pieces.");
	    if (!objects[spellbook->otyp].oc_name_known &&
		!objects[spellbook->otyp].oc_uname)
		docall(spellbook);
	    useup(spellbook);
	    gone = TRUE;
	} else {
	    pline("You find yourself reading the %s line over and over again.",
		spellbook == book ? "next" : "first");
	}
	return gone;
}